

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

aiString * __thiscall
Assimp::FBX::FBXConverter::GetTexturePath
          (aiString *__return_storage_ptr__,FBXConverter *this,Texture *tex)

{
  bool bVar1;
  uint uVar2;
  string *pString;
  reference ppVar3;
  uint64_t uVar4;
  mapped_type *pmVar5;
  ImportSettings *pIVar6;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_> local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_> local_38;
  const_iterator it;
  uint index;
  bool textureReady;
  Video *media;
  Texture *tex_local;
  FBXConverter *this_local;
  aiString *path;
  
  media = (Video *)tex;
  tex_local = (Texture *)this;
  this_local = (FBXConverter *)__return_storage_ptr__;
  aiString::aiString(__return_storage_ptr__);
  pString = Texture::RelativeFilename_abi_cxx11_((Texture *)media);
  aiString::Set(__return_storage_ptr__,pString);
  _index = Texture::Media((Texture *)media);
  if (_index != (Video *)0x0) {
    it._M_node._7_1_ = 0;
    local_40._M_node =
         (_Base_ptr)
         std::
         map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
         ::find(&this->textures_converted,(key_type *)&index);
    std::_Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>::
    _Rb_tree_const_iterator(&local_38,&local_40);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
         ::end(&this->textures_converted);
    std::_Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>::
    _Rb_tree_const_iterator(&local_48,&local_50);
    bVar1 = std::operator!=(&local_38,&local_48);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>::
               operator*(&local_38);
      it._M_node._0_4_ = ppVar3->second;
      it._M_node._7_1_ = 1;
    }
    else {
      uVar4 = Video::ContentLength(_index);
      if (uVar4 != 0) {
        uVar2 = ConvertVideo(this,_index);
        it._M_node._0_4_ = uVar2;
        pmVar5 = std::
                 map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
                 ::operator[](&this->textures_converted,(key_type *)&index);
        *pmVar5 = uVar2;
        it._M_node._7_1_ = 1;
      }
    }
    pIVar6 = Document::Settings(this->doc);
    if (((pIVar6->useLegacyEmbeddedTextureNaming & 1U) != 0) && ((it._M_node._7_1_ & 1) != 0)) {
      __return_storage_ptr__->data[0] = '*';
      uVar2 = ASSIMP_itoa10(__return_storage_ptr__->data + 1,0x3ff,(uint)it._M_node);
      __return_storage_ptr__->length = uVar2 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

aiString FBXConverter::GetTexturePath(const Texture* tex)
        {
            aiString path;
            path.Set(tex->RelativeFilename());

            const Video* media = tex->Media();
            if (media != nullptr) {
                bool textureReady = false; //tells if our texture is ready (if it was loaded or if it was found)
                unsigned int index;

                VideoMap::const_iterator it = textures_converted.find(media);
                if (it != textures_converted.end()) {
                    index = (*it).second;
                    textureReady = true;
                }
                else {
                    if (media->ContentLength() > 0) {
                        index = ConvertVideo(*media);
                        textures_converted[media] = index;
                        textureReady = true;
                    }
                }

                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture), if the texture is ready
                if (doc.Settings().useLegacyEmbeddedTextureNaming) {
                    if (textureReady) {
                        // TODO: check the possibility of using the flag "AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING"
                        // In FBX files textures are now stored internally by Assimp with their filename included
                        // Now Assimp can lookup through the loaded textures after all data is processed
                        // We need to load all textures before referencing them, as FBX file format order may reference a texture before loading it
                        // This may occur on this case too, it has to be studied
                        path.data[0] = '*';
                        path.length = 1 + ASSIMP_itoa10(path.data + 1, MAXLEN - 1, index);
                    }
                }
            }

            return path;
        }